

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ClosestPointData * __thiscall
CMeshClosestPointMapper::SamplePoint::ClosestPoint(SamplePoint *this,int fi)

{
  vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
  *this_00;
  iterator __position;
  long lVar1;
  pointer pCVar2;
  ClosestPointData *pCVar3;
  
  this_00 = &this->m_closestMeshPts;
  pCVar3 = (this->m_closestMeshPts).
           super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_closestMeshPts).
                    super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar3) < 0x780) {
    std::
    vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
    ::reserve(this_00,0x1e);
    pCVar3 = (this_00->
             super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  __position._M_current =
       (this->m_closestMeshPts).
       super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != pCVar3) {
    lVar1 = (long)__position._M_current - (long)pCVar3 >> 6;
    lVar1 = lVar1 + (ulong)(lVar1 == 0);
    do {
      if (pCVar3->m_fi == fi) {
        return pCVar3;
      }
      pCVar3 = pCVar3 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  if (__position._M_current ==
      (this->m_closestMeshPts).
      super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
    ::_M_realloc_insert<>(this_00,__position);
    pCVar2 = (this->m_closestMeshPts).
             super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->m_P).y = 0.0;
    ((__position._M_current)->m_P).z = 0.0;
    (__position._M_current)->m_t[3] = 0.0;
    ((__position._M_current)->m_P).x = 0.0;
    (__position._M_current)->m_t[1] = 0.0;
    (__position._M_current)->m_t[2] = 0.0;
    *(undefined8 *)__position._M_current = 0;
    (__position._M_current)->m_t[0] = 0.0;
    pCVar2 = (this->m_closestMeshPts).
             super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_closestMeshPts).
    super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  ClosestPtToMeshFace(this->m_mesh,fi,&this->m_pt,&pCVar2[-1].m_P,&pCVar2[-1].m_t);
  pCVar2[-1].m_fi = fi;
  return pCVar2 + -1;
}

Assistant:

const ClosestPointData& ClosestPoint(int fi)
    {
      if (m_closestMeshPts.capacity() < 30)
      {
        m_closestMeshPts.reserve(30);
      }
      for (int i = 0; i < m_closestMeshPts.size(); i++)
      {
        if (m_closestMeshPts[i].m_fi == fi)
        {
          return m_closestMeshPts[i];
        }
      }
      m_closestMeshPts.emplace_back();
      ClosestPointData& q = m_closestMeshPts.back();
      ::ClosestPtToMeshFace(&m_mesh, fi, m_pt, q.m_P, q.m_t);
      q.m_fi = fi;
      return q;
    }